

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 int32_to_float128_sparc(int32_t a,float_status *status)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  
  if (a != 0) {
    uVar3 = (ulong)(uint)-a;
    if (0 < a) {
      uVar3 = (ulong)(uint)a;
    }
    uVar1 = 0x1f;
    if ((uint)uVar3 != 0) {
      for (; (uint)uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = ((ulong)(0x401d - (uVar1 ^ 0x1f)) << 0x30) + ((ulong)((uint)a >> 0x1f) << 0x3f) +
                   (uVar3 << ((char)(uVar1 ^ 0x1f) + 0x11U & 0x3f));
    return (float128)(auVar2 << 0x40);
  }
  return (float128)ZEXT816(0);
}

Assistant:

float128 int32_to_float128(int32_t a, float_status *status)
{
    flag zSign;
    uint32_t absA;
    int8_t shiftCount;
    uint64_t zSig0;

    if ( a == 0 ) return packFloat128( 0, 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz32(absA) + 17;
    zSig0 = absA;
    return packFloat128( zSign, 0x402E - shiftCount, zSig0<<shiftCount, 0 );

}